

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellRegisterNamespace
              (xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  undefined1 *puVar4;
  char *pcVar5;
  undefined1 *puVar6;
  char *local_50;
  xmlChar *next;
  xmlChar *href;
  xmlChar *prefix;
  xmlChar *nsListDup;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *arg_local;
  xmllintShellCtxtPtr ctxt_local;
  
  pcVar3 = (char *)xmlStrdup(arg);
  local_50 = pcVar3;
  do {
    pcVar1 = local_50;
    if ((local_50 == (char *)0x0) || (*local_50 == '\0')) {
      (*_xmlFree)(pcVar3);
      return 0;
    }
    puVar4 = (undefined1 *)xmlStrchr(local_50,0x3d);
    if (puVar4 == (undefined1 *)0x0) {
      fprintf((FILE *)ctxt->output,"setns: prefix=[nsuri] required\n");
      (*_xmlFree)(pcVar3);
      return -1;
    }
    puVar6 = puVar4 + 1;
    *puVar4 = 0;
    pcVar5 = (char *)xmlStrchr(puVar6,0x20);
    local_50 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      local_50 = pcVar5 + 1;
      *pcVar5 = '\0';
    }
    iVar2 = xmlXPathRegisterNs(ctxt->pctxt,pcVar1,puVar6);
  } while (iVar2 == 0);
  fprintf((FILE *)ctxt->output,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",
          pcVar1,puVar6);
  (*_xmlFree)(pcVar3);
  return -1;
}

Assistant:

static int
xmllintShellRegisterNamespace(xmllintShellCtxtPtr ctxt, char *arg,
      xmlNodePtr node ATTRIBUTE_UNUSED, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlChar* nsListDup;
    xmlChar* prefix;
    xmlChar* href;
    xmlChar* next;

    nsListDup = xmlStrdup((xmlChar *) arg);
    next = nsListDup;
    while(next != NULL) {
	/* skip spaces */
	/*while((*next) == ' ') next++;*/
	if((*next) == '\0') break;

	/* find prefix */
	prefix = next;
	next = (xmlChar*)xmlStrchr(next, '=');
	if(next == NULL) {
	    fprintf(ctxt->output, "setns: prefix=[nsuri] required\n");
	    xmlFree(nsListDup);
	    return(-1);
	}
	*(next++) = '\0';

	/* find href */
	href = next;
	next = (xmlChar*)xmlStrchr(next, ' ');
	if(next != NULL) {
	    *(next++) = '\0';
	}

	/* do register namespace */
	if(xmlXPathRegisterNs(ctxt->pctxt, prefix, href) != 0) {
	    fprintf(ctxt->output,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n", prefix, href);
	    xmlFree(nsListDup);
	    return(-1);
	}
    }

    xmlFree(nsListDup);
    return(0);
}